

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

iterator __thiscall
cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Push
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *this,iterator it)

{
  iterator iVar1;
  iterator iVar2;
  BuildsystemDirectoryStateType local_250;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *local_48;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcStack_40;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *local_30;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *this_local;
  iterator it_local;
  
  pcStack_40 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)it.Position;
  local_48 = it.Tree;
  local_30 = this;
  this_local = local_48;
  it_local.Tree = pcStack_40;
  memset(&local_250,0,0x208);
  cmStateDetail::BuildsystemDirectoryStateType::BuildsystemDirectoryStateType(&local_250);
  iVar2.Position = (PositionType)pcStack_40;
  iVar2.Tree = local_48;
  iVar2 = Push_impl(this,iVar2,&local_250);
  it_local.Position = (PositionType)iVar2.Tree;
  cmStateDetail::BuildsystemDirectoryStateType::~BuildsystemDirectoryStateType(&local_250);
  iVar1.Position = iVar2.Position;
  iVar1.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)it_local.Position;
  return iVar1;
}

Assistant:

iterator Push(iterator it) { return Push_impl(it, T()); }